

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

bool doctest::detail::binary_assert<0,std::__cxx11::string,char[5]>
               (Enum at,char *file,int line,char *expr,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               char (*rhs) [5])

{
  code *pcVar1;
  char (*op) [5];
  char extraout_AL;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  ContextOptions *pCVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  ResultBuilder rb;
  String local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  char (*local_c8) [5];
  AssertData local_c0;
  
  local_d0 = lhs;
  iVar4 = std::__cxx11::string::compare((char *)lhs);
  local_c0.m_failed = iVar4 != 0;
  if (is_running_in_test == '\0') {
    if (iVar4 == 0) goto LAB_001264d6;
    String::String(&local_e8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)&local_c0,at,file,line,expr,"",&local_e8);
    String::~String(&local_e8);
    stringifyBinaryExpr<std::__cxx11::string,char[5]>
              (&local_e8,(detail *)local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13743b,*rhs,
               (char (*) [5])expr);
    String::operator=(&local_c0.m_decomp,&local_e8);
    String::~String(&local_e8);
    failed_out_of_a_testing_context(&local_c0);
    bVar3 = isDebuggerActive();
    if (bVar3) {
      pCVar5 = getContextOptions();
      if (pCVar5->no_breaks == false) {
        pcVar1 = (code *)swi(3);
        uVar2 = (*pcVar1)();
        return (bool)uVar2;
      }
    }
    bVar3 = checkIfShouldThrow(at);
    if (bVar3) {
      throwException();
    }
    String::~String((String *)&local_c0.m_exception_string);
  }
  else {
    local_c8 = rhs;
    String::String(&local_e8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)&local_c0,at,file,line,expr,"",&local_e8);
    String::~String(&local_e8);
    op = local_c8;
    if (iVar4 == 0) {
      pCVar5 = getContextOptions();
      __x = extraout_XMM0_Qa;
      if (pCVar5->success == true) goto LAB_0012637f;
    }
    else {
LAB_0012637f:
      stringifyBinaryExpr<std::__cxx11::string,char[5]>
                (&local_e8,(detail *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13743b,*op,
                 (char (*) [5])expr);
      String::operator=(&local_c0.m_decomp,&local_e8);
      String::~String(&local_e8);
      __x = extraout_XMM0_Qa_00;
    }
    ResultBuilder::log((ResultBuilder *)&local_c0,__x);
    if (extraout_AL != '\0') {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return (bool)uVar2;
    }
    if (local_c0.m_failed == true) {
      bVar3 = checkIfShouldThrow(at);
      if (bVar3) {
        throwException();
      }
    }
    String::~String((String *)&local_c0.m_exception_string);
  }
  String::~String(&local_c0.m_decomp);
  String::~String(&local_c0.m_exception);
LAB_001264d6:
  return iVar4 == 0;
}

Assistant:

DOCTEST_NOINLINE bool binary_assert(assertType::Enum at, const char* file, int line,
                                        const char* expr, const DOCTEST_REF_WRAP(L) lhs,
                                        const DOCTEST_REF_WRAP(R) rhs) {
        bool failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        DOCTEST_ASSERT_IN_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        return !failed;
    }